

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O3

int zmq_ctx_term(void *ctx_)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  
  if ((ctx_ != (void *)0x0) && (bVar2 = zmq::ctx_t::check_tag((ctx_t *)ctx_), bVar2)) {
    iVar3 = zmq::ctx_t::terminate((ctx_t *)ctx_);
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (iVar1 != 4 || iVar3 == 0) {
      zmq::shutdown_network();
    }
    *piVar4 = iVar1;
    return iVar3;
  }
  piVar4 = __errno_location();
  *piVar4 = 0xe;
  return -1;
}

Assistant:

int zmq_ctx_term (void *ctx_)
{
    if (!ctx_ || !(static_cast<zmq::ctx_t *> (ctx_))->check_tag ()) {
        errno = EFAULT;
        return -1;
    }

    const int rc = (static_cast<zmq::ctx_t *> (ctx_))->terminate ();
    const int en = errno;

    //  Shut down only if termination was not interrupted by a signal.
    if (!rc || en != EINTR) {
        zmq::shutdown_network ();
    }

    errno = en;
    return rc;
}